

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_Color __thiscall
ON_SurfaceDraftAngleColorMapping::Color
          (ON_SurfaceDraftAngleColorMapping *this,ON_3dVector surface_normal)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double t;
  double h;
  double n_dot_up;
  double mx;
  double mn;
  double a1;
  double a0;
  ON_SurfaceDraftAngleColorMapping *this_local;
  
  bVar4 = IsSet(this);
  if (bVar4) {
    dVar1 = ON_Interval::operator[](&this->m_angle_range_in_radians,0);
    dVar2 = ON_Interval::operator[](&this->m_angle_range_in_radians,1);
    dVar1 = cos(1.5707963267948966 - dVar1);
    dVar2 = cos(1.5707963267948966 - dVar2);
    dVar3 = ON_3dVector::operator*(&surface_normal,&this->m_up);
    if (1e-08 < ABS(dVar1 - dVar2)) {
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) goto LAB_00710d1b;
      dVar1 = (dVar3 - dVar1) / (dVar2 - dVar1);
      if (0.0 < dVar1) {
        if (dVar1 < 1.0) {
          t = ON_Interval::ParameterAt(&this->m_hue_range_in_radians,dVar1);
        }
        else {
          t = ON_Interval::operator[](&this->m_hue_range_in_radians,1);
        }
      }
      else {
        t = ON_Interval::operator[](&this->m_hue_range_in_radians,0);
      }
    }
    else if ((dVar1 <= dVar3) || (dVar2 <= dVar3)) {
      if ((dVar3 <= dVar1) || (dVar3 <= dVar2)) {
        t = ON_Interval::ParameterAt(&this->m_hue_range_in_radians,0.5);
      }
      else {
        t = ON_Interval::operator[](&this->m_hue_range_in_radians,1);
      }
    }
    else {
      t = ON_Interval::operator[](&this->m_hue_range_in_radians,0);
    }
    this_local._4_4_ = (anon_union_4_2_6147a14e_for_ON_Color_15)ON_Color::FromHueInRadians(t);
  }
  else {
LAB_00710d1b:
    this_local._4_4_ = ON_Color::UnsetColor.field_0;
  }
  return (ON_Color)this_local._4_4_;
}

Assistant:

const ON_Color ON_SurfaceDraftAngleColorMapping::Color(
  ON_3dVector surface_normal
) const
{
  for (;;)
  {
    if (false == IsSet())
      break;

    const double a0 = ON_HALFPI - this->m_angle_range_in_radians[0];
    const double a1 = ON_HALFPI - this->m_angle_range_in_radians[1];
    const double mn = cos(a0);
    const double mx = cos(a1);

    const double n_dot_up = surface_normal * this->m_up;
    double h;

    if (fabs(mn - mx) <= 1e-8)
    {
      if (n_dot_up < mn && n_dot_up < mx)
        h = this->m_hue_range_in_radians[0];
      else if (n_dot_up > mn && n_dot_up > mx)
        h = this->m_hue_range_in_radians[1];
      else
        h = this->m_hue_range_in_radians.ParameterAt(0.5);
    }
    else if (mn != mx)
    {
      double t = (n_dot_up - mn) / (mx - mn);
      if (t <= 0.0)
        h = this->m_hue_range_in_radians[0];
      else if (t >= 1.0)
        h = this->m_hue_range_in_radians[1];
      else
        h = this->m_hue_range_in_radians.ParameterAt(t);
    }
    else
      break;

    return ON_Color::FromHueInRadians(h);
  }
  return ON_Color::UnsetColor;
}